

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O2

void __thiscall Container::cleanup_root(Container *this)

{
  pointer pcVar1;
  path *ppVar2;
  ContextManager *pCVar3;
  directory_iterator local_138;
  directory_iterator __end1;
  error_code error;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_108;
  path local_f8;
  path *local_d0;
  Container *local_c8;
  path local_c0;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  error._M_value = 0;
  error._M_cat = (error_category *)std::_V2::system_category();
  local_d0 = &this->work_dir_;
  local_c8 = this;
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&local_108,local_d0);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78,&local_108);
  local_138._M_dir._M_ptr = local_78._M_ptr;
  local_138._M_dir._M_refcount._M_pi = local_78._M_refcount._M_pi;
  local_78._M_ptr = (element_type *)0x0;
  local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&local_108);
  __end1._M_dir._M_ptr = (element_type *)0x0;
  __end1._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  while (local_138._M_dir._M_refcount._M_pi != __end1._M_dir._M_refcount._M_pi) {
    ppVar2 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_138);
    std::filesystem::remove_all(ppVar2,&error);
    if (error._M_value != 0) {
      pCVar3 = ContextManager::get();
      pcVar1 = (ppVar2->_M_pathname)._M_dataplus._M_p;
      (**(code **)(*(long *)error._M_cat + 0x20))(&local_f8,error._M_cat,error._M_value);
      format_abi_cxx11_(&local_c0._M_pathname,"Cannot remove %s: %s",pcVar1,
                        local_f8._M_pathname._M_dataplus._M_p);
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    std::filesystem::__cxx11::directory_iterator::operator++(&local_138);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&__end1._M_dir._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_dir._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
  ppVar2 = &local_c8->root_;
  std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
            (&local_f8,(char (*) [4])"tmp",auto_format);
  std::filesystem::__cxx11::operator/(&local_c0,ppVar2,&local_f8);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&local_108,&local_c0);
  std::filesystem::__cxx11::path::~path(&local_c0);
  std::filesystem::__cxx11::path::~path(&local_f8);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,&local_108);
  local_138._M_dir._M_ptr = local_88._M_ptr;
  local_138._M_dir._M_refcount._M_pi = local_88._M_refcount._M_pi;
  local_88._M_ptr = (element_type *)0x0;
  local_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&local_108);
  __end1._M_dir._M_ptr = (element_type *)0x0;
  __end1._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  while (local_138._M_dir._M_refcount._M_pi != __end1._M_dir._M_refcount._M_pi) {
    ppVar2 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_138);
    std::filesystem::remove_all(ppVar2,&error);
    if (error._M_value != 0) {
      pCVar3 = ContextManager::get();
      pcVar1 = (ppVar2->_M_pathname)._M_dataplus._M_p;
      (**(code **)(*(long *)error._M_cat + 0x20))(&local_f8,error._M_cat,error._M_value);
      format_abi_cxx11_(&local_c0._M_pathname,"Cannot remove %s: %s",pcVar1,
                        local_f8._M_pathname._M_dataplus._M_p);
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    std::filesystem::__cxx11::directory_iterator::operator++(&local_138);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&__end1._M_dir._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_dir._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&local_108,local_d0);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_98,&local_108);
  local_138._M_dir._M_ptr = local_98._M_ptr;
  local_138._M_dir._M_refcount._M_pi = local_98._M_refcount._M_pi;
  local_98._M_ptr = (element_type *)0x0;
  local_98._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,&local_108);
  __end1._M_dir._M_ptr = (element_type *)0x0;
  __end1._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  while (local_138._M_dir._M_refcount._M_pi != __end1._M_dir._M_refcount._M_pi) {
    ppVar2 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_138);
    std::filesystem::remove_all(ppVar2,&error);
    if (error._M_value != 0) {
      pCVar3 = ContextManager::get();
      pcVar1 = (ppVar2->_M_pathname)._M_dataplus._M_p;
      (**(code **)(*(long *)error._M_cat + 0x20))(&local_f8,error._M_cat,error._M_value);
      format_abi_cxx11_(&local_c0._M_pathname,"Cannot remove %s: %s",pcVar1,
                        local_f8._M_pathname._M_dataplus._M_p);
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    std::filesystem::__cxx11::directory_iterator::operator++(&local_138);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&__end1._M_dir._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_dir._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
  return;
}

Assistant:

void Container::cleanup_root() {
    std::error_code error;
    for (const auto &path : fs::directory_iterator(work_dir_)) {
        fs::remove_all(path, error);
        if (error) {
            die(format("Cannot remove %s: %s", path.path().c_str(), error.message().c_str()));
        }
    }

    for (const auto &path : fs::directory_iterator(root_ / "tmp")) {
        fs::remove_all(path, error);
        if (error) {
            die(format("Cannot remove %s: %s", path.path().c_str(), error.message().c_str()));
        }
    }

    for (const auto &path : fs::directory_iterator(work_dir_)) {
        fs::remove_all(path, error);
        if (error) {
            die(format("Cannot remove %s: %s", path.path().c_str(), error.message().c_str()));
        }
    }
}